

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

void __thiscall
Centaurus::CharClass<unsigned_char>::collect_borders
          (CharClass<unsigned_char> *this,
          set<unsigned_char,_std::less<unsigned_char>,_std::allocator<unsigned_char>_> *dest)

{
  pointer pRVar1;
  Range<unsigned_char> *r;
  pointer pRVar2;
  uchar local_2a;
  uchar local_29;
  
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar2 = (this->m_ranges).
                super__Vector_base<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar2 != pRVar1; pRVar2 = pRVar2 + 1) {
    local_29 = pRVar2->m_start;
    std::
    _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
    ::_M_insert_unique<unsigned_char>
              ((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                *)dest,&local_29);
    local_2a = pRVar2->m_end;
    std::
    _Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
    ::_M_insert_unique<unsigned_char>
              ((_Rb_tree<unsigned_char,_unsigned_char,_std::_Identity<unsigned_char>,_std::less<unsigned_char>,_std::allocator<unsigned_char>_>
                *)dest,&local_2a);
  }
  return;
}

Assistant:

void collect_borders(std::set<TCHAR>& dest) const
    {
        for (const auto& r : m_ranges)
        {
            dest.insert(r.start());
            dest.insert(r.end());
        }
    }